

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringtokenizer.h
# Opt level: O3

void __thiscall
QStringTokenizerBase<QLatin1String,_QChar>::iterator::iterator
          (iterator *this,QStringTokenizerBase<QLatin1String,_QChar> *t)

{
  char16_t cVar1;
  uint uVar2;
  CaseSensitivity CVar3;
  long lVar4;
  char *pcVar5;
  QLatin1String QVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long in_FS_OFFSET;
  QStringView QVar11;
  char16_t local_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->tokenizer = t;
  cVar1 = (t->m_needle).ucs;
  uVar2 = (t->super_QStringTokenizerBaseBase).m_sb.
          super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
          super_QFlagsStorage<Qt::SplitBehaviorFlags>.i;
  CVar3 = (t->super_QStringTokenizerBaseBase).m_cs;
  lVar4 = (t->m_haystack).m_size;
  pcVar5 = (t->m_haystack).m_data;
  QVar6 = t->m_haystack;
  lVar8 = 0;
  lVar7 = 0;
  do {
    lVar9 = lVar7;
    if (lVar8 < 0) {
      (this->current).value.m_size = 0;
      (this->current).value.m_data = (char *)0x0;
      (this->current).ok = false;
      goto LAB_0018a4e9;
    }
    QVar11.m_data = &local_3a;
    QVar11.m_size = 1;
    local_3a = cVar1;
    lVar8 = QtPrivate::findString(QVar6,lVar9,QVar11,CVar3);
    lVar10 = lVar4;
    lVar7 = lVar9;
    if (-1 < lVar8) {
      lVar10 = lVar8;
      lVar7 = lVar8 + 1;
    }
  } while (((uVar2 & 1) != 0) && (lVar10 == lVar9));
  (this->current).value.m_size = lVar10 - lVar9;
  (this->current).value.m_data = pcVar5 + lVar9;
  (this->current).ok = true;
  lVar9 = lVar7;
LAB_0018a4e9:
  (this->current).state.start = lVar9;
  (this->current).state.end = lVar8;
  (this->current).state.extra = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit iterator(const QStringTokenizerBase &t) noexcept
            : tokenizer{&t}, current{t.toFront()} {}